

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

void soul::ASTUtilities::removeModulesWithSpecialisationParams(Namespace *ns)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  Namespace *ns_00;
  anon_class_1_0_00000001_for__M_pred local_5d [13];
  pool_ref<soul::AST::ModuleBase> local_50;
  pool_ptr<soul::AST::Namespace> local_48;
  pool_ptr<soul::AST::Namespace> sub;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *__end2;
  pool_ref<soul::AST::ModuleBase> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_18;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2;
  Namespace *ns_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)ns;
  iVar2 = (*(ns->super_ModuleBase).super_ASTObject._vptr_ASTObject[0x18])();
  __begin2 = (pool_ref<soul::AST::ModuleBase> *)CONCAT44(extraout_var,iVar2);
  local_18 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_18);
  ppVar3 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_18);
  for (; __end2 != ppVar3; __end2 = __end2 + 1) {
    sub.object = (Namespace *)__end2;
    local_50 = (pool_ref<soul::AST::ModuleBase>)__end2->object;
    cast<soul::AST::Namespace,soul::AST::ModuleBase>((soul *)&local_48,&local_50);
    pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_50);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_48);
    if (bVar1) {
      ns_00 = pool_ptr<soul::AST::Namespace>::operator*(&local_48);
      removeModulesWithSpecialisationParams(ns_00);
    }
    pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_48);
  }
  removeIf<std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>,soul::ASTUtilities::removeModulesWithSpecialisationParams(soul::AST::Namespace&)::_lambda(soul::pool_ref<soul::AST::ModuleBase>&)_1_>
            ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)(__range2 + 0x1a),local_5d);
  return;
}

Assistant:

static void removeModulesWithSpecialisationParams (AST::Namespace& ns)
    {
        for (auto& m : ns.getSubModules())
            if (auto sub = cast<AST::Namespace> (m))
                removeModulesWithSpecialisationParams (*sub);

        removeIf (ns.subModules,
                  [] (pool_ref<AST::ModuleBase>& m) { return ! m->getSpecialisationParameters().empty(); });
    }